

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O0

void aom_hadamard_lp_8x8_dual_avx2(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  undefined1 (*pauVar1) [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [12];
  undefined8 *in_RDX;
  long in_RSI;
  undefined1 (*in_RDI) [32];
  __m256i src [8];
  undefined8 local_220;
  undefined8 uStackY_218;
  undefined8 uStackY_210;
  undefined8 uStackY_208;
  undefined8 local_1e0;
  undefined8 uStackY_1d8;
  undefined8 uStackY_1d0;
  undefined8 uStackY_1c8;
  undefined8 local_1a0;
  int iter;
  undefined1 auVar19 [12];
  __m256i *in;
  undefined8 uStack_188;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  auVar18 = auVar19;
  auVar10 = *in_RDI;
  auVar2 = *in_RDI;
  pauVar1 = (undefined1 (*) [32])(*in_RDI + in_RSI * 2);
  auVar11 = *pauVar1;
  auVar3 = *pauVar1;
  pauVar1 = (undefined1 (*) [32])(*pauVar1 + in_RSI * 2);
  auVar12 = *pauVar1;
  auVar4 = *pauVar1;
  pauVar1 = (undefined1 (*) [32])(*pauVar1 + in_RSI * 2);
  auVar13 = *pauVar1;
  auVar5 = *pauVar1;
  pauVar1 = (undefined1 (*) [32])(*pauVar1 + in_RSI * 2);
  auVar14 = *pauVar1;
  auVar6 = *pauVar1;
  pauVar1 = (undefined1 (*) [32])(*pauVar1 + in_RSI * 2);
  auVar15 = *pauVar1;
  auVar7 = *pauVar1;
  pauVar1 = (undefined1 (*) [32])(*pauVar1 + in_RSI * 2);
  auVar16 = *pauVar1;
  auVar8 = *pauVar1;
  auVar17 = *(undefined1 (*) [32])(*pauVar1 + in_RSI * 2);
  auVar9 = *(undefined1 (*) [32])(*pauVar1 + in_RSI * 2);
  hadamard_col8x2_avx2(in,iter);
  auVar19 = auVar18;
  hadamard_col8x2_avx2(in,iter);
  auVar2 = vperm2i128_avx2(auVar2,auVar3,0x20);
  local_60 = auVar2._0_8_;
  uStack_58 = auVar2._8_8_;
  uStack_50 = auVar2._16_8_;
  uStack_48 = auVar2._24_8_;
  *in_RDX = local_60;
  in_RDX[1] = uStack_58;
  in_RDX[2] = uStack_50;
  in_RDX[3] = uStack_48;
  auVar2 = vperm2i128_avx2(auVar4,auVar5,0x20);
  local_a0 = auVar2._0_8_;
  uStack_98 = auVar2._8_8_;
  uStack_90 = auVar2._16_8_;
  uStack_88 = auVar2._24_8_;
  in_RDX[4] = local_a0;
  in_RDX[5] = uStack_98;
  in_RDX[6] = uStack_90;
  in_RDX[7] = uStack_88;
  auVar2 = vperm2i128_avx2(auVar6,auVar7,0x20);
  local_e0 = auVar2._0_8_;
  uStack_d8 = auVar2._8_8_;
  uStack_d0 = auVar2._16_8_;
  uStack_c8 = auVar2._24_8_;
  in_RDX[8] = local_e0;
  in_RDX[9] = uStack_d8;
  in_RDX[10] = uStack_d0;
  in_RDX[0xb] = uStack_c8;
  auVar2 = vperm2i128_avx2(auVar8,auVar9,0x20);
  local_120 = auVar2._0_8_;
  uStack_118 = auVar2._8_8_;
  uStack_110 = auVar2._16_8_;
  uStack_108 = auVar2._24_8_;
  in_RDX[0xc] = local_120;
  in_RDX[0xd] = uStack_118;
  in_RDX[0xe] = uStack_110;
  in_RDX[0xf] = uStack_108;
  auVar2 = vperm2i128_avx2(auVar10,auVar11,0x31);
  local_160 = auVar2._0_8_;
  uStack_158 = auVar2._8_8_;
  uStack_150 = auVar2._16_8_;
  uStack_148 = auVar2._24_8_;
  in_RDX[0x10] = local_160;
  in_RDX[0x11] = uStack_158;
  in_RDX[0x12] = uStack_150;
  in_RDX[0x13] = uStack_148;
  auVar2 = vperm2i128_avx2(auVar12,auVar13,0x31);
  local_1a0 = auVar2._0_8_;
  in = auVar2._16_8_;
  uStack_188 = auVar2._24_8_;
  in_RDX[0x14] = local_1a0;
  in_RDX[0x15] = auVar2._8_8_;
  in_RDX[0x16] = in;
  in_RDX[0x17] = uStack_188;
  auVar2 = vperm2i128_avx2(auVar14,auVar15,0x31);
  local_1e0 = auVar2._0_8_;
  uStackY_1d8 = auVar2._8_8_;
  uStackY_1d0 = auVar2._16_8_;
  uStackY_1c8 = auVar2._24_8_;
  in_RDX[0x18] = local_1e0;
  in_RDX[0x19] = uStackY_1d8;
  in_RDX[0x1a] = uStackY_1d0;
  in_RDX[0x1b] = uStackY_1c8;
  auVar2 = vperm2i128_avx2(auVar16,auVar17,0x31);
  local_220 = auVar2._0_8_;
  uStackY_218 = auVar2._8_8_;
  uStackY_210 = auVar2._16_8_;
  uStackY_208 = auVar2._24_8_;
  in_RDX[0x1c] = local_220;
  in_RDX[0x1d] = uStackY_218;
  in_RDX[0x1e] = uStackY_210;
  in_RDX[0x1f] = uStackY_208;
  return;
}

Assistant:

void aom_hadamard_lp_8x8_dual_avx2(const int16_t *src_diff,
                                   ptrdiff_t src_stride, int16_t *coeff) {
  __m256i src[8];
  src[0] = _mm256_loadu_si256((const __m256i *)src_diff);
  src[1] = _mm256_loadu_si256((const __m256i *)(src_diff += src_stride));
  src[2] = _mm256_loadu_si256((const __m256i *)(src_diff += src_stride));
  src[3] = _mm256_loadu_si256((const __m256i *)(src_diff += src_stride));
  src[4] = _mm256_loadu_si256((const __m256i *)(src_diff += src_stride));
  src[5] = _mm256_loadu_si256((const __m256i *)(src_diff += src_stride));
  src[6] = _mm256_loadu_si256((const __m256i *)(src_diff += src_stride));
  src[7] = _mm256_loadu_si256((const __m256i *)(src_diff + src_stride));

  hadamard_col8x2_avx2(src, 0);
  hadamard_col8x2_avx2(src, 1);

  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[0], src[1], 0x20));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[2], src[3], 0x20));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[4], src[5], 0x20));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[6], src[7], 0x20));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[0], src[1], 0x31));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[2], src[3], 0x31));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[4], src[5], 0x31));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[6], src[7], 0x31));
}